

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O3

any __thiscall
Scine::Core::ModuleManager::Impl::get(Impl *this,string *interface,string *model,string *moduleName)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_t sVar4;
  char cVar5;
  int iVar6;
  pointer pcVar7;
  undefined8 *puVar8;
  uint uVar9;
  long *in_R8;
  bool bVar10;
  string modulePtrLower;
  string moduleNameLower;
  long *local_b8;
  size_t local_b0;
  long local_a8 [2];
  placeholder *local_98;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  locale local_70 [8];
  long *local_68;
  size_t local_60;
  long local_58 [2];
  pointer local_48;
  pointer local_40;
  undefined8 *local_38;
  
  local_98 = (placeholder *)this;
  std::locale::locale((locale *)&local_90);
  local_68 = local_58;
  std::__cxx11::string::
  _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
            ((string *)&local_68,*in_R8,(locale *)&local_90,in_R8[1] + *in_R8,(locale *)&local_90);
  std::locale::~locale((locale *)&local_90);
  if ((in_R8[1] == 0) || (iVar6 = std::__cxx11::string::compare((char *)&local_68), iVar6 == 0)) {
    pcVar1 = (pointer)interface->_M_string_length;
    for (pcVar7 = (interface->_M_dataplus)._M_p; pcVar7 != pcVar1; pcVar7 = pcVar7 + 0x20) {
      puVar2 = *(undefined8 **)(pcVar7 + 0x10);
      for (puVar8 = *(undefined8 **)(pcVar7 + 8); puVar8 != puVar2; puVar8 = puVar8 + 2) {
        cVar5 = (**(code **)(*(long *)*puVar8 + 0x20))((long *)*puVar8,model,moduleName);
        if (cVar5 != '\0') {
          (**(code **)(*(long *)*puVar8 + 0x18))(local_98,(long *)*puVar8,model,moduleName);
LAB_00109b3e:
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          return (any)local_98;
        }
      }
    }
  }
  else {
    pcVar7 = (interface->_M_dataplus)._M_p;
    local_48 = (pointer)interface->_M_string_length;
    if (pcVar7 != local_48) {
      do {
        puVar8 = *(undefined8 **)(pcVar7 + 8);
        local_38 = *(undefined8 **)(pcVar7 + 0x10);
        local_40 = pcVar7;
        if (puVar8 != local_38) {
          do {
            (**(code **)(*(long *)*puVar8 + 0x10))((string *)&local_b8);
            std::locale::locale(local_70);
            local_90 = local_80;
            std::__cxx11::string::
            _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
                      ((string *)&local_90,local_b8,local_70,local_b0 + (long)local_b8,local_70);
            std::locale::~locale(local_70);
            if (local_b8 != local_a8) {
              operator_delete(local_b8,local_a8[0] + 1);
            }
            sVar4 = local_60;
            plVar3 = local_68;
            if ((local_88 == local_60) &&
               ((local_88 == 0 || (iVar6 = bcmp(local_90,local_68,local_88), iVar6 == 0)))) {
LAB_00109a2e:
              cVar5 = (**(code **)(*(long *)*puVar8 + 0x20))((long *)*puVar8,model,moduleName);
              uVar9 = 0;
              if (cVar5 != '\0') {
                uVar9 = 1;
                (**(code **)(*(long *)*puVar8 + 0x18))(local_98,(long *)*puVar8,model,moduleName);
              }
            }
            else {
              local_b8 = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,plVar3,sVar4 + (long)plVar3);
              std::__cxx11::string::append((char *)&local_b8);
              plVar3 = local_b8;
              if (local_88 == local_b0) {
                if (local_88 == 0) {
                  bVar10 = false;
                }
                else {
                  iVar6 = bcmp(local_90,local_b8,local_88);
                  bVar10 = iVar6 != 0;
                }
              }
              else {
                bVar10 = true;
              }
              if (plVar3 != local_a8) {
                operator_delete(plVar3,local_a8[0] + 1);
              }
              uVar9 = 5;
              if (!bVar10) goto LAB_00109a2e;
            }
            if (local_90 != local_80) {
              operator_delete(local_90,local_80[0] + 1);
            }
            if ((uVar9 != 5) && (uVar9 != 0)) {
              if ((uVar9 & 1) != 0) goto LAB_00109b3e;
              break;
            }
            puVar8 = puVar8 + 2;
          } while (puVar8 != local_38);
        }
        pcVar7 = local_40 + 0x20;
      } while (pcVar7 != local_48);
    }
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = &PTR__exception_00111d30;
  __cxa_throw(puVar8,&ClassNotImplementedError::typeinfo,std::exception::~exception);
}

Assistant:

boost::any get(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }
    else {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }

    throw ClassNotImplementedError{};
  }